

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oasis.h
# Opt level: O3

void initstreams(string *inFile,string *outFile)

{
  FILE *pFVar1;
  char *__dest;
  long extraout_RDX;
  char *__src;
  string *psVar2;
  ulong __n;
  size_type sStack_40;
  string *psStack_38;
  
  if (outFile->_M_string_length != 0) {
    __src = "wb";
    pFVar1 = freopen((outFile->_M_dataplus)._M_p,"wb",_stdout);
    if (pFVar1 == (FILE *)0x0) {
      initstreams();
      goto LAB_00101617;
    }
  }
  if (inFile->_M_string_length != 0) {
    __src = "rb";
    pFVar1 = freopen((inFile->_M_dataplus)._M_p,"rb",_stdin);
    if (pFVar1 == (FILE *)0x0) {
LAB_00101617:
      psVar2 = inFile;
      initstreams();
      psStack_38 = inFile;
      if (extraout_RDX == 0 || __src != (char *)0x0) {
        __n = extraout_RDX - (long)__src;
        sStack_40 = __n;
        if (__n < 0x10) {
          __dest = (psVar2->_M_dataplus)._M_p;
        }
        else {
          __dest = (char *)std::__cxx11::string::_M_create((ulong *)psVar2,(ulong)&sStack_40);
          (psVar2->_M_dataplus)._M_p = __dest;
          (psVar2->field_2)._M_allocated_capacity = sStack_40;
        }
        if (__n != 0) {
          if (__n == 1) {
            *__dest = *__src;
          }
          else {
            memcpy(__dest,__src,__n);
          }
        }
        psVar2->_M_string_length = sStack_40;
        (psVar2->_M_dataplus)._M_p[sStack_40] = '\0';
        return;
      }
      std::__throw_logic_error("basic_string::_M_construct null not valid");
      halt_baddata();
    }
  }
  freopen((char *)0x0,"a+b",_stdout);
  freopen((char *)0x0,"rb",_stdin);
  return;
}

Assistant:

inline void initstreams(std::string inFile="", std::string outFile="")
{

   if (outFile.length() > 0){
       if (freopen(outFile.c_str(), "wb", stdout) == NULL) {
		   fprintf(stderr, "%s: Error opening file %s\n", __func__, outFile.c_str());
           exit(-1);
        }
   }

   if (inFile.length() > 0){
        if (freopen(inFile.c_str(), "rb", stdin) == NULL) {
			fprintf(stderr, "%s: Error opening file %s\n", __func__, inFile.c_str());
            exit(-1);
         }
   }

#if defined(_MSC_VER) || defined(__MINGW32__)
	_setmode(_fileno(stdout), O_BINARY);
	_setmode(_fileno(stdin), O_BINARY);
#elif __APPLE__
	freopen(NULL, "wb", stdout);
	freopen(NULL, "rb", stdin);
#elif __linux
	freopen(NULL, "a+b", stdout);
	freopen(NULL, "rb", stdin);
#endif

}